

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

utf8_size_t utf8_char_count(char *data,size_t size)

{
  size_t sVar1;
  ulong in_RSI;
  char *in_RDI;
  utf8_size_t count;
  size_t bytes;
  size_t i;
  utf8_size_t local_28;
  ulong local_18;
  ulong local_10;
  
  local_28 = 0;
  local_10 = in_RSI;
  if (in_RSI == 0) {
    local_10 = strlen(in_RDI);
  }
  local_18 = 0;
  while ((local_18 < local_10 && (sVar1 = utf8_char_length(in_RDI + local_18), sVar1 != 0))) {
    local_28 = local_28 + 1;
    local_18 = sVar1 + local_18;
  }
  return local_28;
}

Assistant:

utf8_size_t utf8_char_count(const char* data, size_t size)
{
    size_t i, bytes = 0;
    utf8_size_t count = 0;

    if (0 == size) {
        size = strlen(data);
    }

    for (i = 0; i < size; ++count, i += bytes) {
        if (0 == (bytes = utf8_char_length(&data[i]))) {
            break;
        }
    }

    return count;
}